

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O3

void __thiscall duckdb::StatsBindData::~StatsBindData(StatsBindData *this)

{
  pointer pcVar1;
  
  (this->super_FunctionData)._vptr_FunctionData = (_func_int **)&PTR__StatsBindData_02473ac8;
  pcVar1 = (this->stats)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->stats).field_2) {
    operator_delete(pcVar1);
  }
  FunctionData::~FunctionData(&this->super_FunctionData);
  operator_delete(this);
  return;
}

Assistant:

explicit StatsBindData(string stats_p = string()) : stats(std::move(stats_p)) {
	}